

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void pcache1ResizeHash(PCache1 *p)

{
  uint uVar1;
  PgHdr1 *pPVar2;
  ulong uVar3;
  PgHdr1 *pPVar4;
  PgHdr1 **ppPVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar1 = p->nHash * 2;
  uVar6 = 0x100;
  if (0x100 < uVar1) {
    uVar6 = uVar1;
  }
  if ((p->nHash != 0) && (sqlite3Hooks_0 != (code *)0x0)) {
    (*sqlite3Hooks_0)();
  }
  ppPVar5 = (PgHdr1 **)sqlite3MallocZero((ulong)uVar6 << 3);
  if ((p->nHash != 0) && (sqlite3Hooks_1 != (code *)0x0)) {
    (*sqlite3Hooks_1)();
  }
  if (ppPVar5 != (PgHdr1 **)0x0) {
    uVar1 = p->nHash;
    if ((ulong)uVar1 != 0) {
      uVar7 = 0;
      do {
        pPVar4 = p->apHash[uVar7];
        while (pPVar4 != (PgHdr1 *)0x0) {
          uVar3 = (ulong)pPVar4->iKey % (ulong)uVar6;
          pPVar2 = pPVar4->pNext;
          pPVar4->pNext = ppPVar5[uVar3];
          ppPVar5[uVar3] = pPVar4;
          pPVar4 = pPVar2;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar1);
    }
    sqlite3_free(p->apHash);
    p->apHash = ppPVar5;
    p->nHash = uVar6;
  }
  return;
}

Assistant:

static void pcache1ResizeHash(PCache1 *p){
  PgHdr1 **apNew;
  unsigned int nNew;
  unsigned int i;

  assert( sqlite3_mutex_held(p->pGroup->mutex) );

  nNew = p->nHash*2;
  if( nNew<256 ){
    nNew = 256;
  }

  pcache1LeaveMutex(p->pGroup);
  if( p->nHash ){ sqlite3BeginBenignMalloc(); }
  apNew = (PgHdr1 **)sqlite3MallocZero(sizeof(PgHdr1 *)*nNew);
  if( p->nHash ){ sqlite3EndBenignMalloc(); }
  pcache1EnterMutex(p->pGroup);
  if( apNew ){
    for(i=0; i<p->nHash; i++){
      PgHdr1 *pPage;
      PgHdr1 *pNext = p->apHash[i];
      while( (pPage = pNext)!=0 ){
        unsigned int h = pPage->iKey % nNew;
        pNext = pPage->pNext;
        pPage->pNext = apNew[h];
        apNew[h] = pPage;
      }
    }
    sqlite3_free(p->apHash);
    p->apHash = apNew;
    p->nHash = nNew;
  }
}